

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disasm.cpp
# Opt level: O1

Section * __thiscall
Disasm::disasmUntilJump
          (Section *__return_storage_ptr__,Disasm *this,ROMAddress *start,uint maxInstructions)

{
  pointer *ppIVar1;
  iterator __position;
  byte bVar2;
  bool bVar3;
  uint8_t *data;
  int iVar4;
  bool bVar5;
  Instruction inst;
  Instruction local_3d;
  vector<Instruction,std::allocator<Instruction>> *local_38;
  
  (__return_storage_ptr__->instructions).
  super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->instructions).
  super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->instructions).
  super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->start = start;
  if (maxInstructions != 0) {
    local_38 = (vector<Instruction,std::allocator<Instruction>> *)
               &__return_storage_ptr__->instructions;
    iVar4 = maxInstructions - 1;
    do {
      data = SNESROM::operator[](&this->m_ROM,start);
      Instruction::Instruction(&local_3d,&this->m_State,data);
      __position._M_current =
           (__return_storage_ptr__->instructions).
           super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->instructions).
          super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Instruction,std::allocator<Instruction>>::_M_realloc_insert<Instruction_const&>
                  (local_38,__position,&local_3d);
      }
      else {
        (__position._M_current)->m_Size = local_3d.m_Size;
        (__position._M_current)->m_OpCode = local_3d.m_OpCode;
        (__position._M_current)->m_Argument = local_3d.m_Argument;
        ppIVar1 = &(__return_storage_ptr__->instructions).
                   super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppIVar1 = *ppIVar1 + 1;
      }
      bVar2 = Instruction::size(&local_3d);
      ROMAddress::operator+=(start,(uint)bVar2);
      bVar3 = Instruction::isJump(&local_3d);
      bVar5 = iVar4 != 0;
      iVar4 = iVar4 + -1;
    } while (!bVar3 && bVar5);
  }
  __return_storage_ptr__->end = start;
  return __return_storage_ptr__;
}

Assistant:

Disasm::Section Disasm::disasmUntilJump(ROMAddress* start, unsigned int maxInstructions) const {
    Section section;
    section.start = start;
    ROMAddress* pos = start;

    for(unsigned int i = 0; i < maxInstructions; ++i) {
        Instruction inst(m_State, m_ROM[pos]);
        section.instructions.push_back(inst);
        (*pos) += inst.size();

        if(inst.isJump()) {
            break;
        }
    }

    section.end = pos;

    return section;
}